

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::EffectiveSideOrder
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,int side)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 in_ESI;
  long *in_RDI;
  int cindex;
  undefined4 local_4;
  
  iVar1 = (**(code **)(*in_RDI + 0x248))(in_RDI,in_ESI);
  if (iVar1 == 0) {
    local_4 = -1;
  }
  else {
    uVar2 = (**(code **)(*in_RDI + 0x250))(in_RDI,0,in_ESI);
    local_4 = (**(code **)(*in_RDI + 0x3c0))(in_RDI,uVar2);
  }
  return local_4;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::EffectiveSideOrder(int side) const
{
	if(!NSideConnects(side)) return -1;
	int cindex =SideConnectLocId(0, side);
#ifdef PZDEBUG
    if(cindex<0 || cindex >= NConnects()) DebugStop();
#endif
    return ConnectOrder(cindex);

}